

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-make.c
# Opt level: O2

_Bool place_friends(chunk *c,loc grid,monster_race *race,monster_race *friends_race,wchar_t total,
                   _Bool sleep,monster_group_info group_info,uint8_t origin)

{
  _Bool _Var1;
  wchar_t wVar2;
  int iVar3;
  loc new;
  
  iVar3 = c->depth - friends_race->level;
  _Var1 = flag_has_dbg(friends_race->flags,0xc,1,"friends_race->flags","RF_UNIQUE");
  wVar2 = (wchar_t)_Var1;
  if (_Var1) {
    wVar2 = (wchar_t)friends_race->max_num;
    if ((int)(uint)friends_race->max_num <= friends_race->cur_num) goto LAB_00177e69;
  }
  else {
    if (iVar3 < -4) goto LAB_00177e69;
    if (iVar3 < 5) {
      iVar3 = (iVar3 + 5) * total;
      wVar2 = Rand_div(10);
      total = (uint)(iVar3 % 10 < wVar2) + iVar3 / 10;
    }
  }
  if (L'\0' < total) {
    if (race->ridx == friends_race->ridx) {
      _Var1 = place_new_monster_group(c,grid,race,sleep,group_info,total,origin);
      return _Var1;
    }
    wVar2 = scatter_ext((chunk_conflict *)c,&new,L'\x01',grid,(uint)z_info->monster_group_dist,false
                        ,square_isopen);
    if (L'\0' < wVar2) {
      _Var1 = place_new_monster_one(c,new,friends_race,sleep,group_info,origin);
      wVar2 = (wchar_t)_Var1;
      if (total != L'\x01') {
        _Var1 = place_new_monster_group(c,new,friends_race,sleep,group_info,total,origin);
        wVar2 = (wchar_t)_Var1;
      }
    }
  }
LAB_00177e69:
  return (_Bool)(char)wVar2;
}

Assistant:

static bool place_friends(struct chunk *c, struct loc grid, struct monster_race *race,
		struct monster_race *friends_race, int total, bool sleep,
		struct monster_group_info group_info, uint8_t origin)
{
	int extra_chance;

	/* Find the difference between current dungeon depth and monster level */
	int level_difference = c->depth - friends_race->level + 5;

	/* Handle unique monsters */
	bool is_unique = rf_has(friends_race->flags, RF_UNIQUE);

	/* Make sure the unique hasn't been killed already */
	if (is_unique && (friends_race->cur_num >= friends_race->max_num)) {
		return false;
	}

	/* More than 4 levels OoD, no groups allowed */
	if (level_difference <= 0 && !is_unique) {
		return false;
	}

	/* Reduce group size within 5 levels of natural depth*/
	if (level_difference < 10 && !is_unique) {
		extra_chance = (total * level_difference) % 10;
		total = total * level_difference / 10;

		/* Instead of flooring the group value, we use the decimal place
		   as a chance of an extra monster */
		if (randint0(10) > extra_chance) {
			total += 1;
		}
	}

	/* No monsters in this group */
	if (total > 0) {
		/* Handle friends same as original monster */
		if (race->ridx == friends_race->ridx) {
			return place_new_monster_group(c, grid, race, sleep, group_info,
										   total, origin);
		} else {
			struct loc new;

			/* Find a nearby place to put the other groups. */
			if (scatter_ext(c, &new, 1, grid,
					z_info->monster_group_dist, false,
					square_isopen) > 0) {
				/* Place the monsters */
				bool success = place_new_monster_one(c, new,
					friends_race, sleep, group_info, origin);

				if (total > 1) {
					success = place_new_monster_group(c,
						new, friends_race, sleep,
						group_info, total, origin);
				}
				return success;
			}
		}
	}

	return false;
}